

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::PushStyleColor(ImPlotCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  ImPlotContext *pIVar2;
  ImVec4 IVar3;
  ImGuiColorMod local_2c;
  
  pIVar2 = GImPlot;
  pIVar1 = (GImPlot->Style).Colors + idx;
  local_2c.BackupValue.x = pIVar1->x;
  local_2c.BackupValue.y = pIVar1->y;
  local_2c.BackupValue.z = pIVar1->z;
  local_2c.BackupValue.w = pIVar1->w;
  local_2c.Col = idx;
  ImVector<ImGuiColorMod>::push_back(&GImPlot->ColorModifiers,&local_2c);
  IVar3 = ImGui::ColorConvertU32ToFloat4(col);
  (pIVar2->Style).Colors[idx] = IVar3;
  return;
}

Assistant:

void PushStyleColor(ImPlotCol idx, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = gp.Style.Colors[idx];
    gp.ColorModifiers.push_back(backup);
    gp.Style.Colors[idx] = ImGui::ColorConvertU32ToFloat4(col);
}